

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O2

void __thiscall cppcms::crypto::openssl_aes_encryptor::check(openssl_aes_encryptor *this)

{
  size_t sVar1;
  runtime_error *prVar2;
  allocator local_39;
  string local_38;
  
  sVar1 = crypto::key::size(&this->key_);
  if (sVar1 == 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_38,"cppcms::crypto::aes: attempt to use cbc without key",&local_39);
    booster::runtime_error::runtime_error(prVar2,&local_38);
    __cxa_throw(prVar2,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  if (this->iv_initialized_ != false) {
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_38,
             "cppcms::crypto::aes: attempt to use cbc without initial vector set",&local_39);
  booster::runtime_error::runtime_error(prVar2,&local_38);
  __cxa_throw(prVar2,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void check()
		{
			if(key_.size() == 0)
				throw booster::runtime_error("cppcms::crypto::aes: attempt to use cbc without key");
			if(!iv_initialized_)
				throw booster::runtime_error("cppcms::crypto::aes: attempt to use cbc without initial vector set");
		}